

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O0

void __thiscall diy::Bounds<long>::Bounds(Bounds<long> *this,int dim)

{
  undefined4 in_ESI;
  size_t in_RDI;
  DynamicPoint<long,_4UL> *unaff_retaddr;
  undefined4 in_stack_fffffffffffffff0;
  
  DynamicPoint<long,_4UL>::DynamicPoint
            (unaff_retaddr,in_RDI,CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  DynamicPoint<long,_4UL>::DynamicPoint
            (unaff_retaddr,in_RDI,CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  return;
}

Assistant:

Bounds(int dim): min(dim), max(dim)                                 {}